

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_detect.c
# Opt level: O0

_Bool av1_compute_corner_list
                (YV12_BUFFER_CONFIG *frame,int bit_depth,int downsample_level,CornerList *corners)

{
  byte bVar1;
  _Bool _Var2;
  pthread_mutex_t *in_RCX;
  _Bool valid;
  CornerList *in_stack_00000438;
  int in_stack_00000440;
  int in_stack_00000444;
  YV12_BUFFER_CONFIG *in_stack_00000448;
  
  pthread_mutex_lock(in_RCX);
  if ((in_RCX[1].__size[0] & 1U) == 0) {
    _Var2 = compute_corner_list(in_stack_00000448,in_stack_00000444,in_stack_00000440,
                                in_stack_00000438);
    in_RCX[1].__size[0] = _Var2;
  }
  bVar1 = in_RCX[1].__size[0];
  pthread_mutex_unlock(in_RCX);
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool av1_compute_corner_list(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                             int downsample_level, CornerList *corners) {
  assert(corners);

#if CONFIG_MULTITHREAD
  pthread_mutex_lock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD

  if (!corners->valid) {
    corners->valid =
        compute_corner_list(frame, bit_depth, downsample_level, corners);
  }
  bool valid = corners->valid;

#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD
  return valid;
}